

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator)

{
  int iVar1;
  Type TVar2;
  uint32 v;
  uint64 v_00;
  ulong uVar3;
  AlphaNum *in_RDX;
  Printer *in_RSI;
  long in_RDI;
  Hex hex;
  Hex hex_00;
  UnknownFieldSet embedded_unknown_fields;
  string *value;
  string field_number;
  UnknownField *field;
  int i;
  UnknownFieldSet *in_stack_fffffffffffffdb8;
  AlphaNum *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  string *in_stack_fffffffffffffdd0;
  AlphaNum *in_stack_fffffffffffffde8;
  AlphaNum *in_stack_fffffffffffffdf8;
  string local_1d8 [56];
  string *local_1a0;
  undefined1 local_198 [12];
  AlphaNum local_188;
  string local_158 [32];
  undefined1 local_138 [12];
  AlphaNum local_128;
  string local_f8 [80];
  string local_a8 [96];
  string local_48 [32];
  UnknownField *local_28;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  while (iVar5 = iVar4, iVar1 = UnknownFieldSet::field_count((UnknownFieldSet *)0x43647f),
        iVar4 < iVar1) {
    local_28 = UnknownFieldSet::field
                         ((UnknownFieldSet *)in_stack_fffffffffffffdc0,
                          (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    UnknownField::number(local_28);
    strings::AlphaNum::AlphaNum
              (in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    StrCat_abi_cxx11_(in_stack_fffffffffffffdf8);
    TVar2 = UnknownField::type(local_28);
    switch(TVar2) {
    case TYPE_VARINT:
      BaseTextGenerator::PrintString
                ((BaseTextGenerator *)in_stack_fffffffffffffdd0,
                 (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      in_stack_fffffffffffffdf8 = in_RDX;
      BaseTextGenerator::PrintLiteral<3ul>
                ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                 (char (*) [3])in_stack_fffffffffffffdb8);
      in_RDX = in_stack_fffffffffffffdf8;
      UnknownField::varint(local_28);
      strings::AlphaNum::AlphaNum
                (in_stack_fffffffffffffdc0,(unsigned_long)in_stack_fffffffffffffdb8);
      StrCat_abi_cxx11_(in_stack_fffffffffffffdf8);
      BaseTextGenerator::PrintString
                ((BaseTextGenerator *)in_stack_fffffffffffffdd0,
                 (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      std::__cxx11::string::~string(local_a8);
      if ((*(byte *)(in_RDI + 4) & 1) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [2])in_stack_fffffffffffffdb8);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [2])in_stack_fffffffffffffdb8);
      }
      break;
    case TYPE_FIXED32:
      BaseTextGenerator::PrintString
                ((BaseTextGenerator *)in_stack_fffffffffffffdd0,
                 (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      in_stack_fffffffffffffde8 = in_RDX;
      BaseTextGenerator::PrintLiteral<5ul>
                ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                 (char (*) [5])in_stack_fffffffffffffdb8);
      in_RDX = in_stack_fffffffffffffde8;
      v = UnknownField::fixed32(local_28);
      strings::Hex::Hex<unsigned_int>((Hex *)local_138,v,ZERO_PAD_8);
      hex._12_4_ = 0;
      hex.value = local_138._0_8_;
      hex.spec = local_138._8_4_;
      strings::AlphaNum::AlphaNum(&local_128,hex);
      StrCat_abi_cxx11_(in_stack_fffffffffffffdf8);
      BaseTextGenerator::PrintString
                ((BaseTextGenerator *)in_stack_fffffffffffffdd0,
                 (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      std::__cxx11::string::~string(local_f8);
      if ((*(byte *)(in_RDI + 4) & 1) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [2])in_stack_fffffffffffffdb8);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [2])in_stack_fffffffffffffdb8);
      }
      break;
    case TYPE_FIXED64:
      BaseTextGenerator::PrintString
                ((BaseTextGenerator *)in_stack_fffffffffffffdd0,
                 (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      BaseTextGenerator::PrintLiteral<5ul>
                ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                 (char (*) [5])in_stack_fffffffffffffdb8);
      v_00 = UnknownField::fixed64(local_28);
      strings::Hex::Hex<unsigned_long>((Hex *)local_198,v_00,ZERO_PAD_16);
      hex_00._12_4_ = 0;
      hex_00.value = local_198._0_8_;
      hex_00.spec = local_198._8_4_;
      strings::AlphaNum::AlphaNum(&local_188,hex_00);
      StrCat_abi_cxx11_(in_stack_fffffffffffffdf8);
      BaseTextGenerator::PrintString
                ((BaseTextGenerator *)in_stack_fffffffffffffdd0,
                 (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      std::__cxx11::string::~string(local_158);
      if ((*(byte *)(in_RDI + 4) & 1) == 0) {
        BaseTextGenerator::PrintLiteral<2ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [2])in_stack_fffffffffffffdb8);
      }
      else {
        BaseTextGenerator::PrintLiteral<2ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [2])in_stack_fffffffffffffdb8);
      }
      break;
    case TYPE_LENGTH_DELIMITED:
      BaseTextGenerator::PrintString
                ((BaseTextGenerator *)in_stack_fffffffffffffdd0,
                 (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      in_stack_fffffffffffffdd0 = UnknownField::length_delimited_abi_cxx11_(local_28);
      local_1a0 = in_stack_fffffffffffffdd0;
      UnknownFieldSet::UnknownFieldSet((UnknownFieldSet *)0x4368ba);
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) &&
         (in_stack_fffffffffffffdcf =
               UnknownFieldSet::ParseFromString
                         ((UnknownFieldSet *)in_stack_fffffffffffffdd0,
                          (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8)),
         (bool)in_stack_fffffffffffffdcf)) {
        if ((*(byte *)(in_RDI + 4) & 1) == 0) {
          BaseTextGenerator::PrintLiteral<4ul>
                    ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                     (char (*) [4])in_stack_fffffffffffffdb8);
          (**(code **)(in_RDX->piece_data_ + 0x10))();
        }
        else {
          BaseTextGenerator::PrintLiteral<4ul>
                    ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                     (char (*) [4])in_stack_fffffffffffffdb8);
        }
        PrintUnknownFields(in_RSI,(UnknownFieldSet *)in_RDX,
                           (TextGenerator *)CONCAT44(iVar5,in_stack_ffffffffffffffe0));
        if ((*(byte *)(in_RDI + 4) & 1) == 0) {
          (**(code **)(in_RDX->piece_data_ + 0x18))();
          BaseTextGenerator::PrintLiteral<3ul>
                    ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                     (char (*) [3])in_stack_fffffffffffffdb8);
        }
        else {
          BaseTextGenerator::PrintLiteral<3ul>
                    ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                     (char (*) [3])in_stack_fffffffffffffdb8);
        }
      }
      else {
        BaseTextGenerator::PrintLiteral<4ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [4])in_stack_fffffffffffffdb8);
        in_stack_fffffffffffffdc0 = in_RDX;
        in_RDX = in_stack_fffffffffffffdc0;
        CEscape((string *)in_stack_fffffffffffffde8);
        BaseTextGenerator::PrintString
                  ((BaseTextGenerator *)in_stack_fffffffffffffdd0,
                   (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
        std::__cxx11::string::~string(local_1d8);
        if ((*(byte *)(in_RDI + 4) & 1) == 0) {
          BaseTextGenerator::PrintLiteral<3ul>
                    ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                     (char (*) [3])in_stack_fffffffffffffdb8);
        }
        else {
          BaseTextGenerator::PrintLiteral<3ul>
                    ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                     (char (*) [3])in_stack_fffffffffffffdb8);
        }
      }
      UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)in_stack_fffffffffffffdc0);
      break;
    case TYPE_GROUP:
      BaseTextGenerator::PrintString
                ((BaseTextGenerator *)in_stack_fffffffffffffdd0,
                 (string *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
      if ((*(byte *)(in_RDI + 4) & 1) == 0) {
        BaseTextGenerator::PrintLiteral<4ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [4])in_stack_fffffffffffffdb8);
        (**(code **)(in_RDX->piece_data_ + 0x10))();
      }
      else {
        BaseTextGenerator::PrintLiteral<4ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [4])in_stack_fffffffffffffdb8);
      }
      in_stack_fffffffffffffdb8 = UnknownField::group(local_28);
      PrintUnknownFields(in_RSI,(UnknownFieldSet *)in_RDX,
                         (TextGenerator *)CONCAT44(iVar5,in_stack_ffffffffffffffe0));
      if ((*(byte *)(in_RDI + 4) & 1) == 0) {
        (**(code **)(in_RDX->piece_data_ + 0x18))();
        BaseTextGenerator::PrintLiteral<3ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [3])in_stack_fffffffffffffdb8);
      }
      else {
        BaseTextGenerator::PrintLiteral<3ul>
                  ((BaseTextGenerator *)in_stack_fffffffffffffdc0,
                   (char (*) [3])in_stack_fffffffffffffdb8);
      }
    }
    std::__cxx11::string::~string(local_48);
    iVar4 = iVar5 + 1;
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator* generator) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    std::string field_number = StrCat(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator->PrintString(field_number);
        generator->PrintLiteral(": ");
        generator->PrintString(StrCat(field.varint()));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator->PrintString(field_number);
        generator->PrintLiteral(": 0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator->PrintString(field_number);
        generator->PrintLiteral(": 0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator->PrintString(field_number);
        const std::string& value = field.length_delimited();
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && embedded_unknown_fields.ParseFromString(value)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator->PrintLiteral(" { ");
          } else {
            generator->PrintLiteral(" {\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message.
          // So it is probably just a plain string.
          generator->PrintLiteral(": \"");
          generator->PrintString(CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator->PrintString(field_number);
        if (single_line_mode_) {
          generator->PrintLiteral(" { ");
        } else {
          generator->PrintLiteral(" {\n");
          generator->Indent();
        }
        PrintUnknownFields(field.group(), generator);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}